

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

MultiFileColumnDefinition * __thiscall
duckdb::ParquetReader::ParseColumnDefinition
          (MultiFileColumnDefinition *__return_storage_ptr__,ParquetReader *this,
          FileMetaData *file_meta_data,ParquetColumnSchema *element)

{
  pointer pPVar1;
  const_reference pvVar2;
  idx_t __n;
  pointer element_00;
  MultiFileColumnDefinition local_c8;
  
  MultiFileColumnDefinition::MultiFileColumnDefinition
            (__return_storage_ptr__,&element->name,&element->type);
  if (element->schema_type == FILE_ROW_NUMBER) {
    Value::INTEGER((Value *)&local_c8,0x7ffffffd);
    Value::operator=(&__return_storage_ptr__->identifier,(Value *)&local_c8);
    Value::~Value((Value *)&local_c8);
    return __return_storage_ptr__;
  }
  pvVar2 = vector<duckdb_parquet::SchemaElement,_true>::get<true>
                     (&file_meta_data->schema,element->schema_index);
  if (((ushort)pvVar2->__isset & 0x80) == 0) {
    if ((element->parent_schema_index).index == 0xffffffffffffffff) goto LAB_01daf829;
    __n = optional_idx::GetIndex(&element->parent_schema_index);
    pvVar2 = vector<duckdb_parquet::SchemaElement,_true>::get<true>(&file_meta_data->schema,__n);
    if (((ushort)pvVar2->__isset & 0x80) == 0) goto LAB_01daf829;
    Value::INTEGER((Value *)&local_c8,pvVar2->field_id);
  }
  else {
    Value::INTEGER((Value *)&local_c8,pvVar2->field_id);
  }
  Value::operator=(&__return_storage_ptr__->identifier,(Value *)&local_c8);
  Value::~Value((Value *)&local_c8);
LAB_01daf829:
  pPVar1 = (element->children).
           super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
           super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (element_00 = (element->children).
                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    .
                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                    ._M_impl.super__Vector_impl_data._M_start; element_00 != pPVar1;
      element_00 = element_00 + 1) {
    ParseColumnDefinition(&local_c8,this,file_meta_data,element_00);
    ::std::
    vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>::
    emplace_back<duckdb::MultiFileColumnDefinition>
              (&(__return_storage_ptr__->children).
                super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
               ,&local_c8);
    MultiFileColumnDefinition::~MultiFileColumnDefinition(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiFileColumnDefinition ParquetReader::ParseColumnDefinition(const FileMetaData &file_meta_data,
                                                               ParquetColumnSchema &element) {
	MultiFileColumnDefinition result(element.name, element.type);
	if (element.schema_type == ParquetColumnSchemaType::FILE_ROW_NUMBER) {
		result.identifier = Value::INTEGER(MultiFileReader::ORDINAL_FIELD_ID);
		return result;
	}
	auto &column_schema = file_meta_data.schema[element.schema_index];

	if (column_schema.__isset.field_id) {
		result.identifier = Value::INTEGER(column_schema.field_id);
	} else if (element.parent_schema_index.IsValid()) {
		auto &parent_column_schema = file_meta_data.schema[element.parent_schema_index.GetIndex()];
		if (parent_column_schema.__isset.field_id) {
			result.identifier = Value::INTEGER(parent_column_schema.field_id);
		}
	}
	for (auto &child : element.children) {
		result.children.push_back(ParseColumnDefinition(file_meta_data, child));
	}
	return result;
}